

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_4::PtexUtils::deinterleave
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  undefined1 *puVar1;
  undefined2 *puVar2;
  undefined4 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined2 *puVar8;
  undefined4 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined2 *puVar12;
  undefined4 *puVar13;
  
  if (dt - dt_uint16 < 2) {
    if (nchan != 0) {
      puVar2 = (undefined2 *)((long)src + (long)nchan * 2);
      iVar4 = vw * (sstride / 2);
      do {
        if (iVar4 != 0) {
          puVar12 = (undefined2 *)src;
          do {
            if (uw != 0) {
              lVar7 = 0;
              puVar8 = puVar12;
              do {
                *(undefined2 *)((long)dst + lVar7) = *puVar8;
                lVar7 = lVar7 + 2;
                puVar8 = puVar8 + nchan;
              } while ((long)uw * 2 != lVar7);
            }
            puVar12 = puVar12 + sstride / 2;
            dst = (void *)((long)dst + (long)(dstride / 2) * 2);
          } while (puVar12 != (undefined2 *)((long)src + (long)iVar4 * 2));
        }
        src = (void *)((long)src + 2);
      } while ((undefined2 *)src != puVar2);
    }
  }
  else if (dt == dt_float) {
    if (nchan != 0) {
      iVar4 = dstride + 3;
      if (-1 < dstride) {
        iVar4 = dstride;
      }
      puVar3 = (undefined4 *)((long)src + (long)nchan * 4);
      iVar6 = sstride + 3;
      if (-1 < sstride) {
        iVar6 = sstride;
      }
      iVar5 = vw * (iVar6 >> 2);
      do {
        if (iVar5 != 0) {
          puVar13 = (undefined4 *)src;
          do {
            if (uw != 0) {
              lVar7 = 0;
              puVar9 = puVar13;
              do {
                *(undefined4 *)((long)dst + lVar7) = *puVar9;
                lVar7 = lVar7 + 4;
                puVar9 = puVar9 + nchan;
              } while ((long)uw * 4 != lVar7);
            }
            puVar13 = puVar13 + (iVar6 >> 2);
            dst = (void *)((long)dst + (long)(iVar4 >> 2) * 4);
          } while (puVar13 != (undefined4 *)((long)src + (long)iVar5 * 4));
        }
        src = (void *)((long)src + 4);
      } while ((undefined4 *)src != puVar3);
    }
  }
  else if ((dt == dt_uint8) && (nchan != 0)) {
    puVar1 = (undefined1 *)((long)src + (long)nchan);
    do {
      if (vw * sstride != 0) {
        puVar11 = (undefined1 *)src;
        do {
          if (uw != 0) {
            lVar7 = 0;
            puVar10 = puVar11;
            do {
              *(undefined1 *)((long)dst + lVar7) = *puVar10;
              puVar10 = puVar10 + nchan;
              lVar7 = lVar7 + 1;
            } while (uw != lVar7);
          }
          puVar11 = puVar11 + sstride;
          dst = (void *)((long)dst + (long)dstride);
        } while (puVar11 != (undefined1 *)((long)src + (long)(vw * sstride)));
      }
      src = (void *)((long)src + 1);
    } while ((undefined1 *)src != puVar1);
  }
  return;
}

Assistant:

void deinterleave(const void* src, int sstride, int uw, int vw,
                  void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     deinterleave((const uint8_t*) src, sstride, uw, vw,
                                    (uint8_t*) dst, dstride, nchan); break;
    case dt_half:
    case dt_uint16:    deinterleave((const uint16_t*) src, sstride, uw, vw,
                                    (uint16_t*) dst, dstride, nchan); break;
    case dt_float:     deinterleave((const float*) src, sstride, uw, vw,
                                    (float*) dst, dstride, nchan); break;
    }
}